

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::Row<1>::idct(int *pTemp,jpgd_block_t *pSrc)

{
  int iVar1;
  
  iVar1 = (int)*pSrc;
  *pTemp = iVar1 << 2;
  pTemp[1] = iVar1 << 2;
  pTemp[2] = iVar1 << 2;
  pTemp[3] = iVar1 << 2;
  pTemp[4] = iVar1 << 2;
  pTemp[5] = iVar1 << 2;
  pTemp[6] = iVar1 << 2;
  pTemp[7] = iVar1 << 2;
  return;
}

Assistant:

static void idct(int* pTemp, const jpgd_block_t* pSrc)
		{
			const int dcval = left_shifti(pSrc[0], PASS1_BITS);

			pTemp[0] = dcval;
			pTemp[1] = dcval;
			pTemp[2] = dcval;
			pTemp[3] = dcval;
			pTemp[4] = dcval;
			pTemp[5] = dcval;
			pTemp[6] = dcval;
			pTemp[7] = dcval;
		}